

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# call_inst.c
# Opt level: O3

void callIndirect_op(vm *v,instruction *inst)

{
  uint uVar1;
  uint64 *puVar2;
  uint32 uVar3;
  control_frame *pcVar4;
  vm *s;
  
  s = v;
  uVar3 = popU32(&v->operandStack);
  if (uVar3 < (v->table).itemCount) {
    execFunc(v,(v->table).item[uVar3]);
    return;
  }
  callIndirect_op_cold_1();
  uVar1 = *inst->arg;
  puVar2 = (s->operandStack).bp;
  pcVar4 = get_top_fun_control_stack_ele_p(&s->controlStack);
  pushU64(&s->operandStack,puVar2[pcVar4->bp + (ulong)uVar1]);
  return;
}

Assistant:

void callIndirect_op(vm *v, instruction *inst) {
    type_index t_index = ((call_indirectArgs *) inst->arg)->t_index;
    uint32 index = popU32(&v->operandStack);
    if (index >= v->table.itemCount) {
        errorExit("table index is too big\n");
    }
    function_index f_index = *(v->table.item + index);
    execFunc(v, f_index);
}